

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O3

Hop_Obj_t * Amap_ParseFormulaOper(Hop_Man_t *pMan,Vec_Ptr_t *pStackFn,int Oper)

{
  int iVar1;
  Hop_Obj_t *p0;
  uint uVar2;
  Hop_Obj_t *pHVar3;
  void **ppvVar4;
  
  iVar1 = pStackFn->nSize;
  if (0 < iVar1) {
    uVar2 = iVar1 - 1;
    pStackFn->nSize = uVar2;
    if (uVar2 != 0) {
      pHVar3 = (Hop_Obj_t *)pStackFn->pArray[uVar2];
      pStackFn->nSize = iVar1 - 2U;
      p0 = (Hop_Obj_t *)pStackFn->pArray[iVar1 - 2U];
      if (Oper == 7) {
        pHVar3 = Hop_Or(pMan,p0,pHVar3);
      }
      else if (Oper == 8) {
        pHVar3 = Hop_Exor(pMan,p0,pHVar3);
      }
      else {
        if (Oper != 9) {
          return (Hop_Obj_t *)0x0;
        }
        pHVar3 = Hop_And(pMan,p0,pHVar3);
      }
      uVar2 = pStackFn->nSize;
      if (uVar2 == pStackFn->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pStackFn->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pStackFn->pArray,0x80);
          }
          pStackFn->pArray = ppvVar4;
          pStackFn->nCap = 0x10;
        }
        else {
          if (pStackFn->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pStackFn->pArray,(ulong)uVar2 << 4);
          }
          pStackFn->pArray = ppvVar4;
          pStackFn->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar4 = pStackFn->pArray;
      }
      iVar1 = pStackFn->nSize;
      pStackFn->nSize = iVar1 + 1;
      ppvVar4[iVar1] = pHVar3;
      return pHVar3;
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Amap_ParseFormulaOper( Hop_Man_t * pMan, Vec_Ptr_t * pStackFn, int Oper )
{
    Hop_Obj_t * gArg1, * gArg2, * gFunc;
    // perform the given operation
    gArg2 = (Hop_Obj_t *)Vec_PtrPop( pStackFn );
    gArg1 = (Hop_Obj_t *)Vec_PtrPop( pStackFn );
	if ( Oper == AMAP_EQN_OPER_AND )
		gFunc = Hop_And( pMan, gArg1, gArg2 );
	else if ( Oper == AMAP_EQN_OPER_OR )
		gFunc = Hop_Or( pMan, gArg1, gArg2 );
	else if ( Oper == AMAP_EQN_OPER_XOR )
		gFunc = Hop_Exor( pMan, gArg1, gArg2 );
	else
		return NULL;
//    Cudd_Ref( gFunc );
//    Cudd_RecursiveDeref( dd, gArg1 );
//    Cudd_RecursiveDeref( dd, gArg2 );
	Vec_PtrPush( pStackFn,  gFunc );
    return gFunc;
}